

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::UpdateParser::UpdateParser(UpdateParser *this,cmCTestSVN *svn,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_009ab738;
  this->SVN = svn;
  (this->RegexUpdate).regmust = (char *)0x0;
  (this->RegexUpdate).program = (char *)0x0;
  (this->RegexUpdate).progsize = 0;
  memset(&this->RegexUpdate,0,0xaa);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexUpdate,"^([ADUCGE ])([ADUCGE ])[B ] +(.+)$");
  return;
}

Assistant:

UpdateParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexUpdate.compile("^([ADUCGE ])([ADUCGE ])[B ] +(.+)$");
  }